

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O2

void intgemm::SSSE3::Kernels8::QuantizeU(float *input,uint8_t *output,float quant_mult,Index size)

{
  FRegister mult_reg;
  long lVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  
  for (lVar1 = (ulong)size << 2; lVar1 != 0; lVar1 = lVar1 + -0x40) {
    mult_reg[1] = quant_mult;
    mult_reg[0] = quant_mult;
    mult_reg[2] = quant_mult;
    mult_reg[3] = quant_mult;
    QuantizeTile8::ConsecutiveU(mult_reg,input);
    *(undefined4 *)output = extraout_XMM0_Da;
    *(undefined4 *)(output + 4) = extraout_XMM0_Db;
    *(undefined4 *)(output + 8) = extraout_XMM0_Dc;
    *(undefined4 *)(output + 0xc) = extraout_XMM0_Dd;
    input = input + 0x10;
    output = output + 0x10;
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void QuantizeU(const float *input, uint8_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(output) % 16 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      *reinterpret_cast<__m128i*>(output) = QuantizeTile8::ConsecutiveU(q, input);
    }
  }